

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void reindexDatabases(Parse *pParse,char *zColl)

{
  long *in_RDI;
  Table *pTab;
  HashElem *k;
  sqlite3 *db;
  int iDb;
  Db *pDb;
  char *zColl_00;
  Table *pTab_00;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar1;
  ExprList *local_18;
  
  pTab_00 = (Table *)*in_RDI;
  local_18 = pTab_00->pCheck;
  for (iVar1 = 0; iVar1 < (int)pTab_00->tnum; iVar1 = iVar1 + 1) {
    for (zColl_00 = *(char **)(*(long *)&local_18->a[0].fg + 0x10); zColl_00 != (char *)0x0;
        zColl_00 = *(char **)zColl_00) {
      reindexTable((Parse *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),pTab_00,zColl_00);
    }
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

static void reindexDatabases(Parse *pParse, char const *zColl){
  Db *pDb;                    /* A single database */
  int iDb;                    /* The database index number */
  sqlite3 *db = pParse->db;   /* The database connection */
  HashElem *k;                /* For looping over tables in pDb */
  Table *pTab;                /* A table in the database */

  assert( sqlite3BtreeHoldsAllMutexes(db) );  /* Needed for schema access */
  for(iDb=0, pDb=db->aDb; iDb<db->nDb; iDb++, pDb++){
    assert( pDb!=0 );
    for(k=sqliteHashFirst(&pDb->pSchema->tblHash);  k; k=sqliteHashNext(k)){
      pTab = (Table*)sqliteHashData(k);
      reindexTable(pParse, pTab, zColl);
    }
  }
}